

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase80::run(TestCase80 *this)

{
  bool bVar1;
  int *piVar2;
  int *local_a8;
  int *local_a0;
  bool local_91;
  int *piStack_90;
  bool _kj_shouldLog;
  int *local_88;
  int *local_80;
  undefined1 local_78 [8];
  DebugComparison<int_*,_int_*> _kjCondition;
  int *i2;
  int *i1;
  Arena arena;
  TestCase80 *this_local;
  
  arena.currentChunk = (ChunkHeader *)this;
  Arena::Arena((Arena *)&i1,0x400);
  piVar2 = Arena::allocate<int>((Arena *)&i1);
  _kjCondition._32_8_ = Arena::allocate<int>((Arena *)&i1);
  local_88 = piVar2 + 1;
  local_80 = (int *)kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_88);
  piStack_90 = (int *)_kjCondition._32_8_;
  kj::_::DebugExpression<int*>::operator==
            ((DebugComparison<int_*,_int_*> *)local_78,(DebugExpression<int*> *)&local_80,
             &stack0xffffffffffffff70);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
  if (!bVar1) {
    local_91 = kj::_::Debug::shouldLog(ERROR);
    while (local_91 != false) {
      local_a0 = piVar2 + 1;
      local_a8 = (int *)_kjCondition._32_8_;
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int*,int*>&,int*,int*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x57,ERROR,
                 "\"failed: expected \" \"(&i1 + 1) == (&i2)\", _kjCondition, &i1 + 1, &i2",
                 (char (*) [36])"failed: expected (&i1 + 1) == (&i2)",
                 (DebugComparison<int_*,_int_*> *)local_78,&local_a0,&local_a8);
      local_91 = false;
    }
  }
  Arena::~Arena((Arena *)&i1);
  return;
}

Assistant:

TEST(Arena, TrivialObject) {
  Arena arena;

  int& i1 = arena.allocate<int>();
  int& i2 = arena.allocate<int>();

  // Trivial objects should be tightly-packed.
  EXPECT_EQ(&i1 + 1, &i2);
}